

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O2

_Bool ethash_quick_check_difficulty
                (ethash_h256_t *header_hash,uint64_t nonce,ethash_h256_t *mix_hash,
                ethash_h256_t *boundary)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  ethash_h256_t return_hash;
  ethash_h256_t local_28;
  
  ethash_quick_hash(&local_28,header_hash,nonce,mix_hash);
  lVar3 = 0;
  do {
    if (lVar3 == 0x20) {
      return true;
    }
    puVar1 = boundary->b + lVar3;
    puVar2 = local_28.b + lVar3;
    lVar3 = lVar3 + 1;
  } while (*puVar2 == *puVar1);
  return *puVar2 < *puVar1;
}

Assistant:

bool ethash_quick_check_difficulty(
	ethash_h256_t const* header_hash,
	uint64_t const nonce,
	ethash_h256_t const* mix_hash,
	ethash_h256_t const* boundary
)
{

	ethash_h256_t return_hash;
	ethash_quick_hash(&return_hash, header_hash, nonce, mix_hash);
	return ethash_check_difficulty(&return_hash, boundary);
}